

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall
chrono::ChFrameMoving<double>::TransformParentToLocal
          (ChFrameMoving<double> *this,ChFrameMoving<double> *parent,ChFrameMoving<double> *local)

{
  ChCoordsys<double> *parentpos;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  ChVector<double> local_48;
  
  ChFrame<double>::TransformParentToLocal
            (&this->super_ChFrame<double>,&parent->super_ChFrame<double>,
             &local->super_ChFrame<double>);
  parentpos = &(parent->super_ChFrame<double>).coord;
  PointSpeedParentToLocal(&local_48,this,&parentpos->pos,&(parent->coord_dt).pos);
  if ((ChCoordsys<double> *)&local_48 != &local->coord_dt) {
    (local->coord_dt).pos.m_data[0] = local_48.m_data[0];
    (local->coord_dt).pos.m_data[1] = local_48.m_data[1];
    (local->coord_dt).pos.m_data[2] = local_48.m_data[2];
  }
  PointAccelerationParentToLocal
            (&local_48,this,&parentpos->pos,&(parent->coord_dt).pos,&(parent->coord_dtdt).pos);
  if ((ChCoordsys<double> *)&local_48 != &local->coord_dtdt) {
    (local->coord_dtdt).pos.m_data[0] = local_48.m_data[0];
    (local->coord_dtdt).pos.m_data[1] = local_48.m_data[1];
    (local->coord_dtdt).pos.m_data[2] = local_48.m_data[2];
  }
  auVar8 = *(undefined1 (*) [16])((this->coord_dt).rot.m_data + 2);
  dVar1 = (local->super_ChFrame<double>).coord.rot.m_data[0];
  auVar18 = *(undefined1 (*) [16])((local->super_ChFrame<double>).coord.rot.m_data + 2);
  dVar30 = (this->coord_dt).rot.m_data[0];
  auVar9._8_8_ = dVar30;
  auVar9._0_8_ = dVar30;
  auVar22._8_8_ = 0x8000000000000000;
  auVar22._0_8_ = 0x8000000000000000;
  dVar30 = (local->super_ChFrame<double>).coord.rot.m_data[1];
  auVar33._8_8_ = dVar30;
  auVar33._0_8_ = dVar30;
  dVar30 = (this->coord_dt).rot.m_data[1];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar30;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[2];
  auVar5 = vmovddup_avx512vl(auVar15);
  auVar6._0_8_ = dVar1 * auVar8._0_8_;
  auVar6._8_8_ = dVar1 * auVar8._8_8_;
  auVar16 = vshufpd_avx(auVar18,auVar18,1);
  auVar19._0_8_ = -auVar8._0_8_;
  auVar19._8_8_ = -auVar8._8_8_;
  dVar29 = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar15 = *(undefined1 (*) [16])(local->super_ChFrame<double>).coord.rot.m_data;
  auVar7._0_8_ = -dVar30;
  auVar7._8_8_ = 0x8000000000000000;
  auVar2 = vshufpd_avx(auVar8,auVar19,1);
  auVar7 = vunpcklpd_avx(auVar7,auVar17);
  auVar17 = vshufpd_avx(auVar19,auVar8,1);
  auVar19 = vfmadd231pd_fma(auVar6,auVar9,auVar18);
  auVar2 = vfmadd213pd_fma(auVar2,auVar33,auVar19);
  auVar6 = vshufpd_avx512vl(auVar15,auVar15,1);
  auVar2 = vfmadd231pd_fma(auVar2,auVar7,auVar16);
  auVar2 = vsubpd_avx(*(undefined1 (*) [16])((parent->coord_dt).rot.m_data + 2),auVar2);
  auVar7 = vmulpd_avx512vl(auVar6,auVar7);
  auVar27._8_8_ = dVar29;
  auVar27._0_8_ = dVar29;
  auVar27._16_8_ = dVar29;
  auVar27._24_8_ = dVar29;
  auVar7 = vfmadd231pd_fma(auVar7,auVar15,auVar9);
  auVar3 = vpermpd_avx2(ZEXT1632(auVar2),0x15);
  auVar8 = vfnmadd231pd_avx512vl(auVar7,auVar8,auVar5);
  dVar30 = (local->super_ChFrame<double>).coord.rot.m_data[3];
  auVar28._8_8_ = dVar30;
  auVar28._0_8_ = dVar30;
  auVar8 = vfmadd213pd_fma(auVar17,auVar28,auVar8);
  auVar40._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar40._8_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar40._16_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar40._24_8_ =
       -(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar8 = vsubpd_avx(*(undefined1 (*) [16])(parent->coord_dt).rot.m_data,auVar8);
  auVar23 = vpermpd_avx2(ZEXT1632(auVar8),1);
  auVar4 = vpermpd_avx2(auVar40,0xd0);
  auVar39 = ZEXT832((ulong)(this->super_ChFrame<double>).coord.rot.m_data[1]);
  auVar4 = vblendpd_avx(auVar4,auVar39,1);
  auVar4 = vblendpd_avx(auVar4,auVar27,8);
  auVar26._16_16_ = auVar2;
  auVar26._0_16_ = auVar8;
  auVar36._8_8_ = auVar2._0_8_;
  auVar36._0_8_ = auVar2._0_8_;
  auVar8 = vshufpd_avx(auVar8,auVar8,3);
  auVar20._0_8_ = auVar23._0_8_ * auVar4._0_8_;
  auVar20._8_8_ = auVar23._8_8_ * auVar4._8_8_;
  auVar20._16_8_ = auVar23._16_8_ * auVar4._16_8_;
  auVar20._24_8_ = auVar23._24_8_ * auVar4._24_8_;
  dVar30 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar4._8_8_ = dVar30;
  auVar4._0_8_ = dVar30;
  auVar4._16_8_ = dVar30;
  auVar4._24_8_ = dVar30;
  auVar20 = vfmadd132pd_avx512vl(auVar26,auVar20,auVar4);
  auVar4 = *(undefined1 (*) [32])((this->super_ChFrame<double>).coord.rot.m_data + 2);
  auVar36._16_16_ = auVar8;
  auVar23 = vperm2f128_avx(auVar4,ZEXT1632(CONCAT88(0x8000000000000000,dVar29)),0x20);
  auVar4 = vperm2f128_avx(auVar4,auVar39,0x20);
  auVar23 = vpermpd_avx2(auVar23,0x24);
  auVar8 = vfmadd213pd_fma(auVar36,auVar23,auVar20);
  auVar23 = vpermpd_avx2(auVar40,0x11);
  auVar4 = vshufpd_avx(auVar4,auVar23,9);
  auVar19 = vfmadd213pd_fma(auVar4,auVar3,ZEXT1632(auVar8));
  *(undefined1 (*) [32])(local->coord_dt).rot.m_data = ZEXT1632(auVar19);
  auVar9 = vshufpd_avx512vl(auVar19,auVar19,3);
  auVar8 = *(undefined1 (*) [16])((this->coord_dtdt).rot.m_data + 2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->coord_dtdt).rot.m_data[0];
  auVar10 = vmovddup_avx512vl(auVar2);
  dVar30 = (this->coord_dtdt).rot.m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar30;
  auVar2 = *(undefined1 (*) [16])((this->coord_dt).rot.m_data + 2);
  auVar11 = vpermilpd_avx512vl(*(undefined1 (*) [16])((parent->coord_dtdt).rot.m_data + 2),1);
  dVar29 = (this->coord_dt).rot.m_data[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar29;
  auVar17 = vshufpd_avx(auVar8,auVar8,1);
  auVar35._0_8_ = -dVar30;
  auVar35._8_8_ = 0x8000000000000000;
  auVar12 = vshufpd_avx512vl(auVar2,auVar2,1);
  auVar38._0_8_ = -dVar29;
  auVar38._8_8_ = 0x8000000000000000;
  dVar30 = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar32._0_8_ = dVar1 * auVar17._0_8_;
  auVar32._8_8_ = dVar1 * auVar17._8_8_;
  auVar13 = vxorpd_avx512vl(auVar17,auVar22);
  auVar7 = vunpcklpd_avx(auVar14,auVar35);
  auVar14 = vunpcklpd_avx512vl(auVar37,auVar38);
  auVar24._0_8_ = auVar15._0_8_ * auVar7._0_8_;
  auVar24._8_8_ = auVar15._8_8_ * auVar7._8_8_;
  auVar15 = vfmadd231pd_avx512vl(auVar32,auVar10,auVar16);
  auVar16 = vunpckhpd_avx512vl(auVar13,auVar8);
  auVar6 = vfmadd231pd_avx512vl(auVar24,auVar10,auVar6);
  auVar15 = vfmadd213pd_fma(auVar16,auVar33,auVar15);
  dVar1 = (this->coord_dt).rot.m_data[0];
  auVar34._8_8_ = dVar1;
  auVar34._0_8_ = dVar1;
  auVar10._8_8_ = auVar19._0_8_;
  auVar10._0_8_ = auVar19._0_8_;
  auVar16 = vfnmadd231pd_avx512vl(auVar6,auVar17,auVar5);
  auVar17 = vmulpd_avx512vl(auVar12,auVar10);
  auVar18 = vfmadd231pd_fma(auVar15,auVar7,auVar18);
  auVar8 = vunpcklpd_avx512vl(auVar8,auVar13);
  auVar15 = vfmadd213pd_fma(auVar8,auVar28,auVar16);
  auVar8 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
  auVar16 = vsubpd_avx512vl(auVar11,auVar18);
  auVar18 = vshufpd_avx512vl((undefined1  [16])0x0,(undefined1  [16])0x0,1);
  auVar7 = vxorpd_avx512vl(auVar12,auVar22);
  auVar23._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar23._8_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar23._16_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar23._24_8_ =
       -(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar17 = vfmadd213pd_avx512vl(auVar18,auVar34,auVar17);
  auVar18 = vunpckhpd_avx(auVar7,auVar2);
  auVar18 = vfmadd213pd_avx512vl(auVar9,auVar18,auVar17);
  auVar17 = vpermilpd_avx512vl(*(undefined1 (*) [16])(parent->coord_dtdt).rot.m_data,1);
  auVar5 = vfmadd231pd_avx512vl(auVar18,auVar14,(undefined1  [16])0x0);
  auVar17 = vsubpd_avx512vl(auVar17,auVar15);
  auVar15 = vmulpd_avx512vl(auVar14,auVar19);
  auVar18 = vshufpd_avx(auVar19,auVar19,1);
  auVar19 = vaddpd_avx512vl(auVar5,auVar5);
  auVar15 = vfmadd213pd_fma(auVar18,auVar34,auVar15);
  auVar18 = vsubpd_avx(auVar16,auVar19);
  auVar3 = vpermpd_avx2(ZEXT1632(auVar18),0x40);
  auVar16 = vfnmadd213pd_avx512vl(ZEXT816(0),auVar12,auVar15);
  auVar15 = vunpcklpd_avx(auVar2,auVar7);
  auVar31._8_8_ = dVar30;
  auVar31._0_8_ = dVar30;
  auVar31._16_8_ = dVar30;
  auVar31._24_8_ = dVar30;
  auVar8 = vfmadd213pd_fma(auVar8,auVar15,auVar16);
  auVar16._0_8_ = auVar8._0_8_ + auVar8._0_8_;
  auVar16._8_8_ = auVar8._8_8_ + auVar8._8_8_;
  auVar4 = vpermpd_avx2(auVar23,0xd0);
  auVar20 = vpermpd_avx2(auVar23,0x11);
  auVar8 = vsubpd_avx(auVar17,auVar16);
  auVar27 = ZEXT832((ulong)(this->super_ChFrame<double>).coord.rot.m_data[1]);
  auVar4 = vblendpd_avx(auVar4,auVar27,1);
  auVar4 = vblendpd_avx(auVar4,auVar31,8);
  auVar39 = vpermpd_avx2(ZEXT1632(auVar8),0x54);
  auVar25._16_16_ = auVar18;
  auVar25._0_16_ = auVar8;
  auVar23 = vshufpd_avx(auVar25,auVar25,5);
  auVar21._0_8_ = auVar4._0_8_ * auVar39._0_8_;
  auVar21._8_8_ = auVar4._8_8_ * auVar39._8_8_;
  auVar21._16_8_ = auVar4._16_8_ * auVar39._16_8_;
  auVar21._24_8_ = auVar4._24_8_ * auVar39._24_8_;
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar39._8_8_ = dVar1;
  auVar39._0_8_ = dVar1;
  auVar39._16_8_ = dVar1;
  auVar39._24_8_ = dVar1;
  auVar21 = vfmadd132pd_avx512vl(auVar23,auVar21,auVar39);
  auVar4 = *(undefined1 (*) [32])((this->super_ChFrame<double>).coord.rot.m_data + 2);
  auVar39 = vpermpd_avx2(auVar25,0xf);
  auVar23 = vperm2f128_avx(auVar4,ZEXT1632(CONCAT88(0x8000000000000000,dVar30)),0x20);
  auVar4 = vperm2f128_avx(auVar4,auVar27,0x20);
  auVar23 = vpermpd_avx2(auVar23,0x24);
  auVar4 = vshufpd_avx(auVar4,auVar20,9);
  auVar8 = vfmadd213pd_fma(auVar39,auVar23,auVar21);
  auVar8 = vfmadd213pd_fma(auVar4,auVar3,ZEXT1632(auVar8));
  *(undefined1 (*) [32])(local->coord_dtdt).rot.m_data = ZEXT1632(auVar8);
  return;
}

Assistant:

void TransformParentToLocal(
        const ChFrameMoving<Real>& parent,  ///< frame to transform, given in parent coordinates
        ChFrameMoving<Real>& local          ///< transformed frame, in local coordinates, will be stored here
    ) const {
        // pos & rot
        ChFrame<Real>::TransformParentToLocal(parent, local);

        // pos_dt
        local.coord_dt.pos = PointSpeedParentToLocal(parent.coord.pos, parent.coord_dt.pos);

        // pos_dtdt
        local.coord_dtdt.pos =
            PointAccelerationParentToLocal(parent.coord.pos, parent.coord_dt.pos, parent.coord_dtdt.pos);

        // rot_dt
        local.coord_dt.rot = this->coord.rot.GetConjugate() % (parent.coord_dt.rot - coord_dt.rot % local.coord.rot);

        // rot_dtdt
        local.coord_dtdt.rot =
            this->coord.rot.GetConjugate() %
            (parent.coord_dtdt.rot - coord_dtdt.rot % local.coord.rot - (coord_dt.rot % local.coord_dt.rot) * 2);
    }